

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTableSet(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  TableSet *pTVar2;
  char *pcVar3;
  size_t sVar4;
  Name tableName;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x127b,"Expression *wasm::TranslateToFuzzReader::makeTableSet(Type)");
  }
  if ((this->exnrefTableName).super_IString.str._M_str != (char *)0x0) {
    uVar1 = Random::upTo(&this->random,2);
    if (uVar1 == 0) {
      sVar4 = (this->exnrefTableName).super_IString.str._M_len;
      pcVar3 = (this->exnrefTableName).super_IString.str._M_str;
      goto LAB_00132952;
    }
  }
  pcVar3 = (this->funcrefTableName).super_IString.str._M_str;
  if (pcVar3 == (char *)0x0) {
    __assert_fail("funcrefTableName",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1290,"Expression *wasm::TranslateToFuzzReader::makeTableSet(Type)");
  }
  sVar4 = (this->funcrefTableName).super_IString.str._M_len;
LAB_00132952:
  tableName.super_IString.str._M_str = pcVar3;
  tableName.super_IString.str._M_len = sVar4;
  pTVar2 = makeTableSet::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)this,tableName);
  return (Expression *)pTVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeTableSet(Type type) {
  assert(type == Type::none);

  // Emit a set to either the funcref table (which always exists) or the exnref
  // one (which might not, if EH is disabled).
  auto makeTableSet = [&](Name tableName) {
    auto* table = wasm.getTable(tableName);
    // Usually emit in-bounds sets, to avoid trapping, but rarely allow
    // anything.
    Expression* index;
    if (allowOOB && oneIn(10)) {
      index = make(table->addressType);
    } else {
      index = builder.makeConst(
        Literal::makeFromInt32(upTo(table->initial), table->addressType));
    }
    auto* value = make(table->type);
    return builder.makeTableSet(tableName, index, value);
  };
  if (exnrefTableName && oneIn(2)) {
    return makeTableSet(exnrefTableName);
  } else {
    assert(funcrefTableName);
    return makeTableSet(funcrefTableName);
  }
}